

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderMaxShaderStorageBlocksTest::iterate
          (GeometryShaderMaxShaderStorageBlocksTest *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  NotSupportedError *pNVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  ulong uVar10;
  void *pvVar11;
  int local_938;
  int local_934;
  MessageBuilder local_930;
  int local_7b0;
  int local_7ac;
  int i_1;
  GLuint offset;
  GLint n_ssb;
  int i;
  MessageBuilder local_620;
  string local_4a0;
  string local_480;
  string local_460;
  MessageBuilder local_440;
  undefined1 local_2ba;
  allocator<char> local_2b9;
  string local_2b8;
  MessageBuilder local_298;
  int local_114;
  long lStack_110;
  GLint m_gl_max_shader_storage_buffer_bindings_value;
  Functions *gl;
  char *vs_code_specialized_raw;
  string local_f8 [8];
  string vs_code_specialized;
  char *gs_code_specialized_raw;
  string local_c8 [8];
  string gs_code_specialized;
  char *fs_code_specialized_raw;
  allocator<char> local_89;
  string local_88 [8];
  string fs_code_specialized;
  GLint ssbo_data_size;
  GLint *ssbo_data;
  GLint ssbo_alignment;
  bool result;
  GLfloat *ptrTF_data;
  GLint *ptrSSBO_data;
  GLint int_size;
  GLint int_alignment;
  GLfloat initial_buffer_data [4];
  char *pcStack_20;
  bool has_shader_compilation_failed;
  GLchar *feedbackVaryings [1];
  GLint expectedValue;
  GLint counter;
  GeometryShaderMaxShaderStorageBlocksTest *this_local;
  
  feedbackVaryings[0]._4_4_ = 0;
  feedbackVaryings[0]._0_4_ = 0;
  pcStack_20 = "gl_Position";
  initial_buffer_data[3]._3_1_ = 1;
  _int_size = 0;
  initial_buffer_data[0] = 0.0;
  initial_buffer_data[1] = 0.0;
  ptrSSBO_data._4_4_ = 0;
  ptrSSBO_data._0_4_ = 4;
  ptrTF_data = (GLfloat *)0x0;
  _ssbo_alignment = (float *)0x0;
  ssbo_data._7_1_ = 1;
  ssbo_data._0_4_ = 0;
  fs_code_specialized.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"",&local_89);
  std::allocator<char>::~allocator(&local_89);
  gs_code_specialized.field_2._8_8_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"",(allocator<char> *)((long)&gs_code_specialized_raw + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gs_code_specialized_raw + 7));
  vs_code_specialized.field_2._8_8_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"",(allocator<char> *)((long)&vs_code_specialized_raw + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&vs_code_specialized_raw + 7));
  gl = (Functions *)0x0;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar6,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x765);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  lStack_110 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lStack_110 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,
             &this->m_gl_max_geometry_shader_storage_blocks_ext_value);
  dVar4 = (**(code **)(lStack_110 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT pname"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x76d);
  local_114 = 0;
  (**(code **)(lStack_110 + 0x868))(0x90dd,&local_114);
  dVar4 = (**(code **)(lStack_110 + 0x800))();
  glu::checkError(dVar4,"glGetIntegerv() failed for GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x773);
  if (this->m_gl_max_geometry_shader_storage_blocks_ext_value < 1) {
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_298,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_298,
                        (char (*) [55])"GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT query value ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c316fc);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,&this->m_gl_max_geometry_shader_storage_blocks_ext_value);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(char (*) [90])
                               "] is less than or equal zero. Shader Storage Blocks in Geometry Shader are not supported."
                       );
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_298);
    if (this->m_gl_max_geometry_shader_storage_blocks_ext_value == 0) {
      local_2ba = 1;
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT is 0",&local_2b9);
      tcu::NotSupportedError::NotSupportedError(pNVar6,&local_2b8);
      local_2ba = 0;
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    ssbo_data._7_1_ = 0;
  }
  else if (local_114 < this->m_gl_max_geometry_shader_storage_blocks_ext_value) {
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_440,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_440,
                        (char (*) [55])"GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT query value ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c316fc);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,&this->m_gl_max_geometry_shader_storage_blocks_ext_value);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (pMVar9,(char (*) [70])
                               "] is greater than GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS query value ["
                       );
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_114);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2aea36f);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_440);
    ssbo_data._7_1_ = 0;
  }
  else {
    GVar5 = (**(code **)(lStack_110 + 0x3c8))();
    this->m_po_id = GVar5;
    dVar4 = (**(code **)(lStack_110 + 0x800))();
    glu::checkError(dVar4,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x79a);
    GVar5 = (**(code **)(lStack_110 + 0x3f0))(0x8b30);
    this->m_fs_id = GVar5;
    GVar5 = (**(code **)(lStack_110 + 0x3f0))(0x8dd9);
    this->m_gs_id = GVar5;
    GVar5 = (**(code **)(lStack_110 + 0x3f0))(0x8b31);
    this->m_vs_id = GVar5;
    dVar4 = (**(code **)(lStack_110 + 0x800))();
    glu::checkError(dVar4,"glCreateShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x7a1);
    (**(code **)(lStack_110 + 0x14c8))(this->m_po_id,1,&stack0xffffffffffffffe0,0x8c8c);
    dVar4 = (**(code **)(lStack_110 + 0x800))();
    glu::checkError(dVar4,"glTransformFeedbackVaryings() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x7a6);
    TestCaseBase::specializeShader_abi_cxx11_(&local_460,&this->super_TestCaseBase,1,&dummy_fs_code)
    ;
    std::__cxx11::string::operator=(local_88,(string *)&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    gs_code_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
    getGSCode_abi_cxx11_(&local_480,this);
    std::__cxx11::string::operator=(local_c8,(string *)&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    vs_code_specialized.field_2._8_8_ = std::__cxx11::string::c_str();
    TestCaseBase::specializeShader_abi_cxx11_(&local_4a0,&this->super_TestCaseBase,1,&dummy_vs_code)
    ;
    std::__cxx11::string::operator=(local_f8,(string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    gl = (Functions *)std::__cxx11::string::c_str();
    bVar2 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_gs_id,1,
                       (char **)((long)&vs_code_specialized.field_2 + 8),this->m_vs_id,1,
                       (char **)&gl,this->m_fs_id,1,
                       (char **)((long)&gs_code_specialized.field_2 + 8),
                       (bool *)((long)initial_buffer_data + 0xf));
    if (bVar2) {
      (**(code **)(lStack_110 + 0x868))(0x90df,&ssbo_data);
      dVar4 = (**(code **)(lStack_110 + 0x800))();
      glu::checkError(dVar4,"glGetIntegerv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x7bf);
      iVar3 = (int)ssbo_data;
      if ((int)ssbo_data < 0) {
        iVar3 = (int)ssbo_data + 3;
      }
      ptrSSBO_data._4_4_ = iVar3 >> 2;
      fs_code_specialized.field_2._12_4_ =
           this->m_gl_max_geometry_shader_storage_blocks_ext_value * (int)ssbo_data;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(int)fs_code_specialized.field_2._12_4_;
      uVar10 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(uVar10);
      if ((int)ssbo_data % 4 == 0) {
        for (offset = 0; (int)offset < this->m_gl_max_geometry_shader_storage_blocks_ext_value;
            offset = offset + 1) {
          *(GLuint *)((long)pvVar11 + (long)(int)(offset * ptrSSBO_data._4_4_) * 4) = offset + 1;
        }
        (**(code **)(lStack_110 + 0x6c8))(1,&this->m_ssbo_id);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glGenBuffers() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x7d9);
        (**(code **)(lStack_110 + 0x40))(0x90d2,this->m_ssbo_id);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glBindBuffer() call failed for GL_SHADER_STORAGE_BUFFER pname.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x7dc);
        (**(code **)(lStack_110 + 0x150))
                  (0x90d2,(long)(int)fs_code_specialized.field_2._12_4_,pvVar11,0x88ea);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glBufferData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x7df);
        if (pvVar11 != (void *)0x0) {
          operator_delete__(pvVar11);
        }
        for (i_1 = 0; i_1 < this->m_gl_max_geometry_shader_storage_blocks_ext_value; i_1 = i_1 + 1)
        {
          local_7ac = i_1 * (int)ssbo_data;
          (**(code **)(lStack_110 + 0x50))(0x90d2,i_1,this->m_ssbo_id,local_7ac,4);
          dVar4 = (**(code **)(lStack_110 + 0x800))();
          glu::checkError(dVar4,"bindBufferRange() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0x7eb);
        }
        (**(code **)(lStack_110 + 0x708))(1,&this->m_vao_id);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glGenVertexArrays() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x7f0);
        (**(code **)(lStack_110 + 0xd8))(this->m_vao_id);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glBindVertexArray() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x7f3);
        (**(code **)(lStack_110 + 0x6c8))(1,&this->m_tfbo_id);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glGenBuffers() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x7f7);
        (**(code **)(lStack_110 + 0x40))(0x8892,this->m_tfbo_id);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glBindBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x7fa);
        (**(code **)(lStack_110 + 0x150))(0x8892,0x10,&int_size,0x88e5);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glBufferData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x7fe);
        (**(code **)(lStack_110 + 0x48))(0x8c8e,0,this->m_tfbo_id);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glBindBufferBase() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x802);
        (**(code **)(lStack_110 + 0x1680))(this->m_po_id);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glUseProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x806);
        (**(code **)(lStack_110 + 0x5e0))(0x8c89);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glEnable() call failed for GL_RASTERIZER_DISCARD pname.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x80a);
        (**(code **)(lStack_110 + 0x30))(0);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glBeginTransformFeedback() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x80d);
        (**(code **)(lStack_110 + 0x538))(0,0,1);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glDrawArrays() call failed for GL_POINTS pname.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x810);
        (**(code **)(lStack_110 + 0x638))();
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glEndTransformFeedback() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x813);
        (**(code **)(lStack_110 + 0x4e8))(0x8c89);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glDisable() call failed for GL_RASTERIZER_DISCARD pname.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x816);
        _ssbo_alignment = (float *)(**(code **)(lStack_110 + 0xd00))(0x8892,0,0x10,1);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glMapBufferRange() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x81b);
        feedbackVaryings[0]._4_4_ = (int)(*_ssbo_alignment + 0.5);
        (**(code **)(lStack_110 + 0x1670))(0x8892);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glUnmapBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x820);
        _ssbo_alignment = (float *)0x0;
        ptrTF_data = (GLfloat *)
                     (**(code **)(lStack_110 + 0xd00))
                               (0x90d2,0,(long)(int)fs_code_specialized.field_2._12_4_,1);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glMapBufferRange() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x827);
        for (local_7b0 = 0; local_7b0 < this->m_gl_max_geometry_shader_storage_blocks_ext_value;
            local_7b0 = local_7b0 + 1) {
          if (ptrTF_data[local_7b0 * ptrSSBO_data._4_4_] != (GLfloat)(local_7b0 + 2)) {
            ssbo_data._7_1_ = 0;
            pTVar8 = tcu::TestContext::getLog
                               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_930,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar9 = tcu::MessageBuilder::operator<<
                               (&local_930,(char (*) [40])"Value read from Shader Storage Buffer [")
            ;
            pMVar9 = tcu::MessageBuilder::operator<<
                               (pMVar9,(int *)(ptrTF_data + local_7b0 * ptrSSBO_data._4_4_));
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [13])"] at index [");
            local_934 = local_7b0 * ptrSSBO_data._4_4_;
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_934);
            pMVar9 = tcu::MessageBuilder::operator<<
                               (pMVar9,(char (*) [34])"]is not equal to expected value [");
            local_938 = local_7b0 + 2;
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_938);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x29dc08e);
            tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_930);
            break;
          }
        }
        (**(code **)(lStack_110 + 0x1670))(0x90d2);
        dVar4 = (**(code **)(lStack_110 + 0x800))();
        glu::checkError(dVar4,"glUnmapBuffer() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0x83e);
        ptrTF_data = (GLfloat *)0x0;
        feedbackVaryings[0]._0_4_ =
             (this->m_gl_max_geometry_shader_storage_blocks_ext_value *
             (this->m_gl_max_geometry_shader_storage_blocks_ext_value + 1)) / 2;
        if (feedbackVaryings[0]._4_4_ != (int)feedbackVaryings[0]) {
          ssbo_data._7_1_ = 0;
        }
      }
      else {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&n_ssb,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&n_ssb,
                            (char (*) [56])"GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT query value ["
                           );
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&ssbo_data);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [46])"]divide with remainder by the size of GLint [");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&ptrSSBO_data);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x29dc08e);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&n_ssb);
        ssbo_data._7_1_ = 0;
      }
    }
    else {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_620,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<(&local_620,(char (*) [31])0x2ae9b7e);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_620);
      ssbo_data._7_1_ = 0;
    }
  }
  if ((ssbo_data._7_1_ & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_88);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderMaxShaderStorageBlocksTest::iterate()
{
	glw::GLint		   counter						 = 0;
	glw::GLint		   expectedValue				 = 0;
	const glw::GLchar* feedbackVaryings[]			 = { "gl_Position" };
	bool			   has_shader_compilation_failed = true;
	const glw::GLfloat initial_buffer_data[4]		 = { 0.0f, 0.0f, 0.0f, 0.0f };
	glw::GLint		   int_alignment				 = 0;
	const glw::GLint   int_size						 = sizeof(glw::GLint);
	glw::GLint*		   ptrSSBO_data					 = DE_NULL;
	glw::GLfloat*	  ptrTF_data					 = DE_NULL;
	bool			   result						 = true;
	glw::GLint		   ssbo_alignment				 = 0;
	glw::GLint*		   ssbo_data					 = DE_NULL;
	glw::GLint		   ssbo_data_size				 = 0;

	std::string fs_code_specialized		= "";
	const char* fs_code_specialized_raw = DE_NULL;
	std::string gs_code_specialized		= "";
	const char* gs_code_specialized_raw = DE_NULL;
	std::string vs_code_specialized		= "";
	const char* vs_code_specialized_raw = DE_NULL;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Retrieve GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT pname value */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,
				   &m_gl_max_geometry_shader_storage_blocks_ext_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT pname");

	/* Retrieve GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS pname value */
	glw::GLint m_gl_max_shader_storage_buffer_bindings_value = 0;

	gl.getIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &m_gl_max_shader_storage_buffer_bindings_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS pname");

	/* Check if m_gl_max_shader_storage_blocks_value is less than or equal zero. */
	if (m_gl_max_geometry_shader_storage_blocks_ext_value <= 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT query value "
						   << "[" << m_gl_max_geometry_shader_storage_blocks_ext_value
						   << "]"
							  " is less than or equal zero. Shader Storage Blocks"
							  " in Geometry Shader are not supported."
						   << tcu::TestLog::EndMessage;

		if (m_gl_max_geometry_shader_storage_blocks_ext_value == 0)
		{
			throw tcu::NotSupportedError("GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT is 0");
		}
		else
		{
			result = false;
			goto end;
		}
	}

	/* Check if m_gl_max_shader_storage_buffer_bindings_value is less than m_gl_max_shader_storage_blocks_value. */
	if (m_gl_max_shader_storage_buffer_bindings_value < m_gl_max_geometry_shader_storage_blocks_ext_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT query value "
						   << "[" << m_gl_max_geometry_shader_storage_blocks_ext_value
						   << "]"
							  " is greater than GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS query value "
							  "["
						   << m_gl_max_shader_storage_buffer_bindings_value << "]." << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Create a program object. */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Create shader objects. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Configure which outputs should be captured by Transform Feedback. */
	gl.transformFeedbackVaryings(m_po_id, 1 /* varyings count */, feedbackVaryings, GL_INTERLEAVED_ATTRIBS);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

	/* Try to link the test program object */
	fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	fs_code_specialized_raw = fs_code_specialized.c_str();

	gs_code_specialized		= getGSCode();
	gs_code_specialized_raw = gs_code_specialized.c_str();

	vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	vs_code_specialized_raw = vs_code_specialized.c_str();

	if (!TestCaseBase::buildProgram(m_po_id, m_gs_id, 1,				  /* n_sh1_body_parts */
									&gs_code_specialized_raw, m_vs_id, 1, /* n_sh2_body_parts */
									&vs_code_specialized_raw, m_fs_id, 1, /* n_sh3_body_parts */
									&fs_code_specialized_raw, &has_shader_compilation_failed))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Program object linking failed." << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Prepare data for Shader Storage Buffer Object. */
	gl.getIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &ssbo_alignment);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed.");

	int_alignment  = ssbo_alignment / int_size;
	ssbo_data_size = m_gl_max_geometry_shader_storage_blocks_ext_value * ssbo_alignment;
	ssbo_data	  = new glw::GLint[ssbo_data_size];

	if ((ssbo_alignment % int_size) != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT query value "
													   "["
						   << ssbo_alignment << "]"
												"divide with remainder by the size of GLint "
												"["
						   << int_size << "]" << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	for (int i = 0; i < m_gl_max_geometry_shader_storage_blocks_ext_value; ++i)
	{
		ssbo_data[i * int_alignment] = i + 1;
	}

	/* Create Shader Storage Buffer Object. */
	gl.genBuffers(1, &m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed for GL_SHADER_STORAGE_BUFFER pname.");

	gl.bufferData(GL_SHADER_STORAGE_BUFFER, ssbo_data_size, ssbo_data, GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Free unused memory. */
	delete[] ssbo_data;
	ssbo_data = NULL;

	/* Bind specific m_ssbo_id buffer region to a specific Shader Storage Buffer binding point. */
	for (glw::GLint n_ssb = 0; n_ssb < (m_gl_max_geometry_shader_storage_blocks_ext_value); ++n_ssb)
	{
		glw::GLuint offset = n_ssb * ssbo_alignment;

		gl.bindBufferRange(GL_SHADER_STORAGE_BUFFER, n_ssb /*binding index*/, m_ssbo_id, offset, int_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bindBufferRange() call failed.");
	}

	/* Configure VAO. */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Create a Buffer Object for Transform Feedback's outputs. */
	gl.genBuffers(1, &m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(glw::GLfloat) * 4 /* four float vector components */, initial_buffer_data,
				  GL_STATIC_READ);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Bind Buffer Object m_tfbo_id to GL_TRANSFORM_FEEDBACK_BUFFER binding point. */
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /*binding index*/, m_tfbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	/* Use program. */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Disable rasterization and make a draw call. After that, turn on rasterization. */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable() call failed for GL_RASTERIZER_DISCARD pname.");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");

	gl.drawArrays(GL_POINTS, 0 /*starting index*/, 1 /*number of indices*/);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed for GL_POINTS pname.");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable() call failed for GL_RASTERIZER_DISCARD pname.");

	/* Retrieve value from Transform Feedback. */
	ptrTF_data = (glw::GLfloat*)gl.mapBufferRange(
		GL_ARRAY_BUFFER, 0 /*offset*/, sizeof(glw::GLfloat) * 4 /* four float vector components */, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

	counter = int(ptrTF_data[0] + 0.5f);

	gl.unmapBuffer(GL_ARRAY_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	ptrTF_data = NULL;

	/* Retrieve values from Shader Storage Buffer Object. */
	ptrSSBO_data =
		(glw::GLint*)gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0 /*offset*/, ssbo_data_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

	for (int i = 0; i < m_gl_max_geometry_shader_storage_blocks_ext_value; ++i)
	{
		if (ptrSSBO_data[i * int_alignment] != i + 2)
		{
			result = false;

			m_testCtx.getLog() << tcu::TestLog::Message << "Value read from Shader Storage Buffer "
														   "["
							   << ptrSSBO_data[i * int_alignment] << "] "
																	 "at index "
																	 "["
							   << i * int_alignment << "]"
													   "is not equal to expected value "
													   "["
							   << i + 2 << "]" << tcu::TestLog::EndMessage;

			break;
		}
	}

	gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	ptrSSBO_data = NULL;

	/* Calculate expected value. */
	expectedValue =
		m_gl_max_geometry_shader_storage_blocks_ext_value * (m_gl_max_geometry_shader_storage_blocks_ext_value + 1) / 2;

	if (counter != expectedValue)
	{
		result = false;
	}

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}